

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialogbuttonbox.cpp
# Opt level: O3

void QDialogButtonBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<QDialogButtonBox::StandardButton> *pQVar1;
  code *pcVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = *_a[1];
      local_10 = &local_20;
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
      goto switchD_0046f97b_caseD_3;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        iVar5 = 1;
LAB_0046fb75:
        QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        iVar5 = 2;
        goto LAB_0046fb75;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        iVar5 = 3;
        goto LAB_0046fb75;
      }
      break;
    default:
      goto switchD_0046f97b_caseD_3;
    }
    goto LAB_0046fbaa;
  case ReadProperty:
    puVar4 = (uint *)*_a;
    if (_id == 2) {
      *(undefined1 *)puVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x468);
    }
    else if (_id == 1) {
      lVar3 = *(long *)(*(long *)(_o + 8) + 0x390);
      if (lVar3 == 0) goto LAB_0046fa53;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 | *(uint *)(*(long *)(*(long *)(_o + 8) + 0x398) + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar3 << 2 != lVar6);
      *puVar4 = uVar7;
    }
    else if (_id == 0) {
      *puVar4 = *(uint *)(*(long *)(_o + 8) + 0x450);
    }
    break;
  case WriteProperty:
    pQVar1 = (QFlagsStorage<QDialogButtonBox::StandardButton> *)*_a;
    if (_id == 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setCenterButtons((QDialogButtonBox *)_o,*(bool *)&pQVar1->i);
        return;
      }
      goto LAB_0046fbaa;
    }
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setStandardButtons((QDialogButtonBox *)_o,(StandardButtons)pQVar1->i);
        return;
      }
      goto LAB_0046fbaa;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setOrientation((QDialogButtonBox *)_o,pQVar1->i);
        return;
      }
      goto LAB_0046fbaa;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == clicked && lVar3 == 0) {
      puVar4 = (uint *)*_a;
LAB_0046fa53:
      *puVar4 = 0;
    }
    else if (pcVar2 == accepted && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == helpRequested && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == rejected && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
  }
switchD_0046f97b_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0046fbaa:
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialogButtonBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->helpRequested(); break;
        case 3: _t->rejected(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)(QAbstractButton * )>(_a, &QDialogButtonBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::helpRequested, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::rejected, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->centerButtons(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 2: _t->setCenterButtons(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}